

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

Llb_Img_t * Llb_CoreStart(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  Llb_Img_t *p;
  DdManager *unique;
  DdManager *unique_00;
  DdManager *unique_01;
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  
  p = (Llb_Img_t *)calloc(1,0x78);
  p->pInit = pInit;
  p->pAig = pAig;
  p->pPars = pPars;
  unique = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
  p->dd = unique;
  unique_00 = Cudd_Init(pAig->nRegs,0,0x100,0x40000,0);
  p->ddG = unique_00;
  unique_01 = Cudd_Init(pAig->nObjs[2],0,0x100,0x40000,0);
  p->ddR = unique_01;
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_00,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_01,CUDD_REORDER_SYMM_SIFT);
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 100;
  pVVar1->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  pVVar1->pArray = ppvVar2;
  p->vRings = pVVar1;
  pVVar3 = Llb_DriverCountRefs(pAig);
  p->vDriRefs = pVVar3;
  pVVar4 = Llb_DriverCollectCs(pAig);
  p->vVarsCs = pVVar4;
  pVVar3 = Llb_DriverCollectNs(pAig,pVVar3);
  p->vVarsNs = pVVar3;
  Llb_CoreSetVarMaps(p);
  return p;
}

Assistant:

Llb_Img_t * Llb_CoreStart( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t *  pPars )
{
    Llb_Img_t * p;
    p = ABC_CALLOC( Llb_Img_t, 1 );
    p->pInit = pInit;
    p->pAig  = pAig;
    p->pPars = pPars;
    p->dd    = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddG   = Cudd_Init( Aig_ManRegNum(pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR   = Cudd_Init( Aig_ManCiNum(pAig),     0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    p->vRings = Vec_PtrAlloc( 100 );
    p->vDriRefs = Llb_DriverCountRefs( pAig );
    p->vVarsCs  = Llb_DriverCollectCs( pAig );
    p->vVarsNs  = Llb_DriverCollectNs( pAig, p->vDriRefs );
    Llb_CoreSetVarMaps( p );
    return p;
}